

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool make_ranged_attack(monster *mon)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t index;
  wchar_t wVar3;
  wchar_t wVar4;
  monster_lore_conflict *lore_00;
  _Bool local_95;
  loc_conflict local_94;
  loc_conflict tgrid;
  _Bool innate;
  _Bool seen;
  char m_name [80];
  bitflag f [12];
  wchar_t failrate;
  wchar_t thrown_spell;
  monster_lore *lore;
  monster *mon_local;
  
  lore_00 = get_lore(mon->race);
  local_95 = false;
  if (player->timed[2] == 0) {
    local_95 = monster_is_visible(mon);
  }
  tgrid.x._3_1_ = local_95;
  tgrid.x._2_1_ = 0;
  _Var1 = monster_can_cast(mon,false);
  if (!_Var1) {
    _Var1 = monster_can_cast(mon,true);
    if (!_Var1) {
      return false;
    }
    tgrid.x._2_1_ = 1;
  }
  flag_copy((bitflag *)(m_name + 0x4c),mon->race->spell_flags,0xc);
  _Var1 = monster_is_smart(mon);
  if (((_Var1) && ((int)mon->hp < (int)mon->maxhp / 10)) && (uVar2 = Rand_div(2), uVar2 == 0)) {
    ignore_spells((bitflag *)(m_name + 0x4c),L'\x0f');
  }
  _Var1 = monster_is_stupid(mon);
  if (!_Var1) {
    remove_bad_spells(mon,(bitflag *)(m_name + 0x4c));
    monster_get_target_dist_grid(mon,(int *)0x0,&local_94);
    _Var1 = test_spells((bitflag *)(m_name + 0x4c),L'\x01');
    if ((_Var1) && (_Var1 = projectable((chunk *)cave,mon->grid,local_94,L'\b'), !_Var1)) {
      ignore_spells((bitflag *)(m_name + 0x4c),L'\x01');
    }
    _Var1 = summon_possible(mon->grid);
    if (!_Var1) {
      ignore_spells((bitflag *)(m_name + 0x4c),L'Ѐ');
    }
  }
  _Var1 = flag_is_empty((bitflag *)(m_name + 0x4c),0xc);
  if (_Var1) {
    mon_local._7_1_ = false;
  }
  else {
    index = choose_attack_spell((bitflag *)(m_name + 0x4c),(_Bool)(tgrid.x._2_1_ & 1),
                                (_Bool)((tgrid.x._2_1_ ^ 0xff) & 1));
    if (index == L'\0') {
      mon_local._7_1_ = false;
    }
    else {
      monster_desc((char *)&tgrid.y,0x50,mon,L'̔');
      _Var1 = monster_is_camouflaged(mon);
      if (_Var1) {
        become_aware((chunk *)cave,mon);
      }
      wVar3 = monster_spell_failrate(mon);
      _Var1 = mon_spell_is_innate(index);
      if ((_Var1) || (wVar4 = Rand_div(100), wVar3 <= wVar4)) {
        disturb(player);
        do_mon_spell(index,mon,(_Bool)(tgrid.x._3_1_ & 1));
        if ((tgrid.x._3_1_ & 1) != 0) {
          flag_on_dbg(lore_00->spell_flags,0xc,index,"lore->spell_flags","thrown_spell");
          _Var1 = mon_spell_is_innate(index);
          if (_Var1) {
            if (lore_00->cast_innate != 0xff) {
              lore_00->cast_innate = lore_00->cast_innate + '\x01';
            }
          }
          else if (lore_00->cast_spell != 0xff) {
            lore_00->cast_spell = lore_00->cast_spell + '\x01';
          }
        }
        if (((player->is_dead & 1U) != 0) && (lore_00->deaths < 0x7fff)) {
          lore_00->deaths = lore_00->deaths + 1;
        }
        lore_update(mon->race,lore_00);
        mon_local._7_1_ = true;
      }
      else {
        msg("%s tries to cast a spell, but fails.",&tgrid.y);
        mon_local._7_1_ = true;
      }
    }
  }
  return mon_local._7_1_;
}

Assistant:

bool make_ranged_attack(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int thrown_spell, failrate;
	bitflag f[RSF_SIZE];
	char m_name[80];
	bool seen = (player->timed[TMD_BLIND] == 0) && monster_is_visible(mon);
	bool innate = false;

	/* Check for cast this turn, non-innate and then innate */
	if (!monster_can_cast(mon, false)) {
		if (!monster_can_cast(mon, true)) {
			return false;
		} else {
			/* We're casting an innate "spell" */
			innate = true;
		}
	}

	/* Extract the racial spell flags */
	rsf_copy(f, mon->race->spell_flags);

	/* Smart monsters can use "desperate" spells */
	if (monster_is_smart(mon) && mon->hp < mon->maxhp / 10 && one_in_(2)) {
		ignore_spells(f, RST_DAMAGE);
	}

	/* Non-stupid monsters do some filtering */
	if (!monster_is_stupid(mon)) {
		struct loc tgrid;

		/* Remove the "ineffective" spells */
		remove_bad_spells(mon, f);

		/* Check for a clean bolt shot */
		monster_get_target_dist_grid(mon, NULL, &tgrid);
		if (test_spells(f, RST_BOLT) &&
			!projectable(cave, mon->grid, tgrid, PROJECT_STOP)) {
			ignore_spells(f, RST_BOLT);
		}

		/* Check for a possible summon */
		if (!summon_possible(mon->grid)) {
			ignore_spells(f, RST_SUMMON);
		}
	}

	/* No spells left */
	if (rsf_is_empty(f)) return false;

	/* Choose a spell to cast */
	thrown_spell = choose_attack_spell(f, innate, !innate);

	/* Abort if no spell was chosen */
	if (!thrown_spell) return false;

	/* There will be at least an attempt now, so get the monster's name */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* If we see a hidden monster try to cast a spell, become aware of it */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* Check for spell failure (innate attacks never fail) */
	failrate = monster_spell_failrate(mon);
	if (!mon_spell_is_innate(thrown_spell) && (randint0(100) < failrate)) {
		msg("%s tries to cast a spell, but fails.", m_name);
		return true;
	}

	/* Cast the spell. */
	disturb(player);
	do_mon_spell(thrown_spell, mon, seen);

	/* Remember what the monster did */
	if (seen) {
		rsf_on(lore->spell_flags, thrown_spell);
		if (mon_spell_is_innate(thrown_spell)) {
			/* Innate spell */
			if (lore->cast_innate < UCHAR_MAX)
				lore->cast_innate++;
		} else {
			/* Bolt or Ball, or Special spell */
			if (lore->cast_spell < UCHAR_MAX)
				lore->cast_spell++;
		}
	}
	if (player->is_dead && (lore->deaths < SHRT_MAX)) {
		lore->deaths++;
	}
	lore_update(mon->race, lore);

	/* A spell was cast */
	return true;
}